

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O0

void __thiscall CHog::calcDiff(CHog *this,uchar *image,double **magnitudeTable)

{
  double dVar1;
  int iVar2;
  int magni;
  int yDiffs;
  int xDiffs;
  int c;
  int y;
  int x;
  double **magnitudeTable_local;
  uchar *image_local;
  CHog *this_local;
  
  yDiffs = 0;
  for (xDiffs = 0; xDiffs < this->imgHeight; xDiffs = xDiffs + 1) {
    for (c = 0; c < this->imgWidth; c = c + 1) {
      this->dx[xDiffs][c] =
           (uint)image[xDiffs * this->widthStep +
                       ((c + -1 + this->imgWidth) % this->imgWidth) * this->imgChannel + yDiffs] -
           (uint)image[xDiffs * this->widthStep +
                       ((c + 1 + this->imgWidth) % this->imgWidth) * this->imgChannel + yDiffs];
      this->dy[xDiffs][c] =
           (uint)image[((xDiffs + -1 + this->imgHeight) % this->imgHeight) * this->widthStep +
                       c * this->imgChannel + yDiffs] -
           (uint)image[((xDiffs + 1 + this->imgHeight) % this->imgHeight) * this->widthStep +
                       c * this->imgChannel + yDiffs];
      dVar1 = magnitudeTable[this->dy[xDiffs][c] + 0xff][this->dx[xDiffs][c] + 0xff];
      for (yDiffs = 1; yDiffs < this->imgChannel; yDiffs = yDiffs + 1) {
        iVar2 = (uint)image[((xDiffs + -1 + this->imgHeight) % this->imgHeight) * this->widthStep +
                            c * this->imgChannel + yDiffs] -
                (uint)image[((xDiffs + 1 + this->imgHeight) % this->imgHeight) * this->widthStep +
                            c * this->imgChannel + yDiffs];
        if ((double)(int)dVar1 < magnitudeTable[iVar2 + 0xff][iVar2 + 0xff]) {
          this->dx[xDiffs][c] =
               (uint)image[xDiffs * this->widthStep +
                           ((c + -1 + this->imgWidth) % this->imgWidth) * this->imgChannel + yDiffs]
               - (uint)image[xDiffs * this->widthStep +
                             ((c + 1 + this->imgWidth) % this->imgWidth) * this->imgChannel + yDiffs
                            ];
          this->dy[xDiffs][c] = iVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void CHog::calcDiff(unsigned char* image, double** magnitudeTable) //图像数据
{
    int x=0, y=0, c=0;
    int xDiffs, yDiffs, magni;
    //cout<<"calculating differential"<<endl;
    //遍历图像//
    for(y=0; y<imgHeight; y++)
    {
        for(x=0; x<imgWidth; x++)
        {
            dx[y][x] = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
            dy[y][x] = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
            magni = magnitudeTable[dy[y][x]+255][dx[y][x]+255];
            for(c=1; c<imgChannel; c++)
            {
                xDiffs = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
                yDiffs = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
                if(magni < magnitudeTable[yDiffs+255][yDiffs+255])
                {
                    dx[y][x] = xDiffs;
                    dy[y][x] = yDiffs;
                }
            }

        }
    }
    //cout<<"differential calculated\t"<<endl;
}